

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O2

void __thiscall
miniros::ServiceClientLink::onResponseWritten(ServiceClientLink *this,ConnectionPtr *conn)

{
  Connection *this_00;
  size_t in_RCX;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  this_00 = (this->connection_).super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this->persistent_ == true) {
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp:259:7)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp:259:7)>
               ::_M_manager;
    local_28._M_unused._M_object = this;
    Connection::read(this_00,4,&local_28,in_RCX);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
    return;
  }
  Connection::drop(this_00,Destructing);
  return;
}

Assistant:

void ServiceClientLink::onResponseWritten(const ConnectionPtr& conn)
{
  (void)conn;
  MINIROS_ASSERT(conn == connection_);

  if (persistent_)
  {
    connection_->read(4,
      [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
      {
        this->onRequestLength(conn, buffer, size, success);
      });
  }
  else
  {
    connection_->drop(Connection::Destructing);
  }
}